

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBucket::~LargeHeapBucket(LargeHeapBucket *this)

{
  anon_class_16_2_41051075 fn;
  HeapInfo *autoHeap;
  Recycler *recycler;
  LargeHeapBucket *this_local;
  
  fn.autoHeap = (this->super_HeapBucket).heapInfo;
  fn.recycler = ((this->super_HeapBucket).heapInfo)->recycler;
  ForEachEditingLargeHeapBlock<Memory::LargeHeapBucket::~ForEachEditingLargeHeapBlock()::__0>
            (this,fn);
  return;
}

Assistant:

LargeHeapBucket::~LargeHeapBucket()
{
    Recycler* recycler = this->heapInfo->recycler;
    HeapInfo* autoHeap = this->heapInfo;

    ForEachEditingLargeHeapBlock([recycler, autoHeap](LargeHeapBlock * heapBlock)
    {
        heapBlock->ReleasePagesShutdown(recycler);
        LargeHeapBlock::Delete(heapBlock);
        RECYCLER_SLOW_CHECK(autoHeap->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]--);
    });
}